

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O2

void ScaleRowDown2_C(uint8_t *src_ptr,ptrdiff_t src_stride,uint8_t *dst,int dst_width)

{
  long lVar1;
  
  for (lVar1 = 0; (int)lVar1 < dst_width + -1; lVar1 = lVar1 + 2) {
    dst[lVar1] = src_ptr[lVar1 * 2 + 1];
    dst[lVar1 + 1] = src_ptr[lVar1 * 2 + 3];
  }
  if ((dst_width & 1U) != 0) {
    dst[lVar1] = src_ptr[lVar1 * 2 + 1];
  }
  return;
}

Assistant:

void ScaleRowDown2_C(const uint8_t* src_ptr,
                     ptrdiff_t src_stride,
                     uint8_t* dst,
                     int dst_width) {
  int x;
  (void)src_stride;
  for (x = 0; x < dst_width - 1; x += 2) {
    dst[0] = src_ptr[1];
    dst[1] = src_ptr[3];
    dst += 2;
    src_ptr += 4;
  }
  if (dst_width & 1) {
    dst[0] = src_ptr[1];
  }
}